

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.cc
# Opt level: O2

csptr __thiscall pstack::Elf::NoteDesc::data(NoteDesc *this)

{
  long *plVar1;
  uint uVar2;
  uint uVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  uint *in_RSI;
  csptr cVar4;
  string local_50 [39];
  allocator<char> local_29;
  
  plVar1 = *(long **)(in_RSI + 4);
  std::__cxx11::string::string<std::allocator<char>>(local_50,"note descriptor",&local_29);
  uVar2 = *in_RSI & 3;
  uVar3 = 4 - uVar2;
  if (uVar2 == 0) {
    uVar3 = 0;
  }
  (**(code **)(*plVar1 + 0x48))(this,plVar1,local_50,(ulong)*in_RSI + (ulong)uVar3 + 0xc,in_RSI[1]);
  std::__cxx11::string::~string(local_50);
  cVar4.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  cVar4.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (csptr)cVar4.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Reader::csptr
NoteDesc::data() const
{
   return io->view("note descriptor", sizeof note + roundup2(note.n_namesz, 4), note.n_descsz);
}